

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O3

uint32_t helper_uqsub16_arm(uint32_t a,uint32_t b)

{
  uint uVar1;
  uint uVar2;
  ushort uVar3;
  ushort uVar4;
  
  uVar2 = (uint)(ushort)((ushort)a - (ushort)b);
  if ((ushort)a < (ushort)b) {
    uVar2 = 0;
  }
  uVar3 = (ushort)(b >> 0x10);
  uVar4 = (ushort)(a >> 0x10);
  uVar1 = 0;
  if (uVar3 <= uVar4) {
    uVar1 = (uint)(ushort)(uVar4 - uVar3);
  }
  return uVar1 << 0x10 | uVar2;
}

Assistant:

uint32_t HELPER(glue(PFX,sub16))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    SUB16(a, b, 0);
    SUB16(a >> 16, b >> 16, 1);
    SET_GE;
    return res;
}